

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

bool __thiscall QLabel::event(QLabel *this,QEvent *e)

{
  short sVar1;
  QLabelPrivate *this_00;
  Data *pDVar2;
  bool bVar3;
  FocusPolicy FVar4;
  QAbstractButton *this_01;
  QWidget *pQVar5;
  
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  sVar1 = *(short *)(e + 8);
  if (sVar1 == 0xe) {
    if (this_00->control != (QWidgetTextControl *)0x0) {
      this_00->field_0x340 = this_00->field_0x340 | 4;
    }
  }
  else if (sVar1 == 0x4b) {
    bVar3 = QLabelPrivate::needTextControl(this_00);
    if (bVar3) {
      QLabelPrivate::ensureTextControl(this_00);
    }
  }
  else if (sVar1 == 100) {
    QWidgetPrivate::setLayoutItemMargins
              ((QWidgetPrivate *)this_00,SE_LabelLayoutItem,(QStyleOption *)0x0);
    QLabelPrivate::updateLabel(this_00);
  }
  else if ((((sVar1 == 0x75) && (*(int *)(e + 0x18) == this_00->shortcutId)) &&
           (pDVar2 = (this_00->buddy).wp.d, pDVar2 != (Data *)0x0)) &&
          ((*(int *)(pDVar2 + 4) != 0 &&
           (pQVar5 = (QWidget *)(this_00->buddy).wp.value, pQVar5 != (QWidget *)0x0)))) {
    FVar4 = QWidget::focusPolicy(pQVar5);
    if (FVar4 != NoFocus) {
      QWidget::setFocus(pQVar5,ShortcutFocusReason);
    }
    this_01 = QtPrivate::qobject_cast_helper<QAbstractButton*,QObject>((QObject *)pQVar5);
    if ((this_01 == (QAbstractButton *)0x0) || (e[0x1c] != (QEvent)0x0)) {
      pQVar5 = QWidget::window((QWidget *)this);
      QWidget::setAttribute(pQVar5,WA_KeyboardFocusChange,true);
    }
    else {
      QAbstractButton::animateClick(this_01);
    }
    return true;
  }
  bVar3 = QFrame::event(&this->super_QFrame,e);
  return bVar3;
}

Assistant:

bool QLabel::event(QEvent *e)
{
    Q_D(QLabel);
    QEvent::Type type = e->type();

#ifndef QT_NO_SHORTCUT
    if (type == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (se->shortcutId() == d->shortcutId) {
            QWidget *w = d->buddy;
            if (!w)
                return QFrame::event(e);
            if (w->focusPolicy() != Qt::NoFocus)
                w->setFocus(Qt::ShortcutFocusReason);
#if QT_CONFIG(abstractbutton)
            QAbstractButton *button = qobject_cast<QAbstractButton *>(w);
            if (button && !se->isAmbiguous())
                button->animateClick();
            else
#endif
                window()->setAttribute(Qt::WA_KeyboardFocusChange);
            return true;
        }
    } else
#endif
    if (type == QEvent::Resize) {
        if (d->control)
            d->textLayoutDirty = true;
    } else if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
               || e->type() == QEvent::MacSizeChange
#endif
               ) {
        d->setLayoutItemMargins(QStyle::SE_LabelLayoutItem);
        d->updateLabel();
    } else if (type == QEvent::Polish) {
        if (d->needTextControl())
            d->ensureTextControl();
    }

    return QFrame::event(e);
}